

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *io;
  TValue k;
  Value local_28;
  undefined4 local_20;
  
  pTVar2 = index2addr(L,idx);
  local_20 = 2;
  pTVar1 = L->top;
  local_28.p = p;
  pTVar3 = luaH_set(L,&((pTVar2->value_).gc)->h,(TValue *)&local_28);
  pTVar3->value_ = pTVar1[-1].value_;
  pTVar3->tt_ = pTVar1[-1].tt_;
  if ((((L->top[-1].tt_ & 0x40) != 0) && (((byte)L->top[-1].value_.f[9] & 3) != 0)) &&
     (((((pTVar2->value_).gc)->gch).marked & 4) != 0)) {
    luaC_barrierback_(L,(pTVar2->value_).gc);
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_rawsetp (lua_State *L, int idx, const void *p) {
  StkId t;
  TValue k;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  setpvalue(&k, cast(void *, p));
  setobj2t(L, luaH_set(L, hvalue(t), &k), L->top - 1);
  luaC_barrierback(L, gcvalue(t), L->top - 1);
  L->top--;
  lua_unlock(L);
}